

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O0

size_t btokBAuthT_keep(size_t l)

{
  size_t sVar1;
  long in_RDI;
  size_t no;
  size_t n;
  bign_deep_i in_stack_00000038;
  size_t in_stack_00000040;
  
  sVar1 = bignStart_keep(in_stack_00000040,in_stack_00000038);
  return sVar1 + 0x238 + (in_RDI * 2 + 0x3fU >> 6) * 0x18 + (in_RDI * 2 + 7U >> 4);
}

Assistant:

size_t btokBAuthT_keep(size_t l)
{
	const size_t n = W_OF_B(2 * l);
	const size_t no = O_OF_B(2 * l);
	return sizeof(bake_bauth_t_o) +
		bignStart_keep(l, btokBAuthT_deep) +
		3 * O_OF_W(n) + no / 2;
}